

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

int ImfHeaderSetM44fAttribute(ImfHeader *hdr,char *name,float (*m) [4])

{
  Iterator IVar1;
  iterator iVar2;
  TypedAttribute<Imath_3_2::Matrix44<float>_> *pTVar3;
  TypedAttribute<Imath_3_2::Matrix44<float>_> local_a0;
  M44f m4;
  
  Imath_3_2::Matrix44<float>::Matrix44(&m4,m);
  IVar1 = Imf_3_4::Header::find((Header *)hdr,name);
  iVar2._M_node = (_Base_ptr)Imf_3_4::Header::end((Header *)hdr);
  if (IVar1._i._M_node == (iterator)iVar2._M_node) {
    Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>_>::TypedAttribute(&local_a0,&m4);
    Imf_3_4::Header::insert((Header *)hdr,name,&local_a0.super_Attribute);
    Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>_>::~TypedAttribute(&local_a0);
  }
  else {
    pTVar3 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>>
                       ((Header *)hdr,name);
    Imath_3_2::Matrix44<float>::operator=(&pTVar3->_value,&m4);
  }
  return 1;
}

Assistant:

int
ImfHeaderSetM44fAttribute (
    ImfHeader* hdr, const char name[], const float m[4][4])
{
    try
    {
        M44f m4 (m);

        if (header (hdr)->find (name) == header (hdr)->end ())
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::M44fAttribute (m4));
        else
            header (hdr)
                ->typedAttribute<
                    OPENEXR_IMF_INTERNAL_NAMESPACE::M44fAttribute> (name)
                .value () = m4;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}